

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O0

bool __thiscall Sector::operator==(Sector *this,Sector *sector)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  const_iterator __first2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  Sector *local_20;
  Sector *sector_local;
  Sector *this_local;
  
  local_20 = sector;
  sector_local = this;
  bVar1 = Header::operator!=(&sector->header,&this->header);
  if (!bVar1) {
    sVar4 = std::vector<Data,_std::allocator<Data>_>::size(&local_20->m_data);
    if ((sVar4 == 0) &&
       (sVar4 = std::vector<Data,_std::allocator<Data>_>::size(&this->m_data), sVar4 == 0)) {
      return true;
    }
    iVar2 = copies(local_20);
    if ((iVar2 != 0) && (iVar2 = copies(this), iVar2 != 0)) {
      iVar2 = data_size(local_20);
      iVar3 = size(local_20);
      if (iVar3 <= iVar2) {
        iVar2 = data_size(this);
        iVar3 = size(this);
        if (iVar3 <= iVar2) {
          pvVar5 = &data_copy(this,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          local_28._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar5);
          pvVar5 = &data_copy(this,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          local_38._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar5);
          iVar2 = size(this);
          local_30 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator+(&local_38,(long)iVar2);
          pvVar5 = &data_copy(local_20,0)->
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          __first2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar5);
          bVar1 = std::
                  equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (local_28,local_30,
                             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )__first2._M_current);
          return bVar1;
        }
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool Sector::operator== (const Sector& sector) const
{
    // Headers must match
    if (sector.header != header)
        return false;

    // If neither has data it's a match
    if (sector.m_data.size() == 0 && m_data.size() == 0)
        return true;

    // Both sectors must have some data
    if (sector.copies() == 0 || copies() == 0)
        return false;

    // Both first sectors must have at least the natural size to compare
    if (sector.data_size() < sector.size() || data_size() < size())
        return false;

    // The natural data contents must match
    return std::equal(data_copy().begin(), data_copy().begin() + size(), sector.data_copy().begin());
}